

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matcher.hpp
# Opt level: O1

bool __thiscall
Kernel::MatchingUtils::
matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>
          (MatchingUtils *this,Term *base,Term *instance,Binder *binder)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  TermList TVar4;
  uint uVar5;
  MatchingUtils *pMVar6;
  TermList __addr;
  Literal *l2;
  TermList *pTVar7;
  Literal *l1;
  
  if ((((*(ulong *)(this + 0x28) & 8) == 0) || ((base->_args[0]._content & 8) == 0)) ||
     (binder = (Binder *)(ulong)*(uint *)(this + 0x10), *(uint *)(this + 0x10) <= base->_weight)) {
    if (((*(ulong *)(this + 0x28) & 0x10) != 0) && (*(int *)(this + 0xc) < 0)) {
      pMVar6 = *(MatchingUtils **)(this + 0x20);
      TVar4 = SortHelper::getEqualityArgumentSort((Literal *)base);
      bVar2 = matchTerms<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>
                        (pMVar6,TVar4,(TermList)instance,binder);
      if (!bVar2) {
        return false;
      }
    }
    uVar5 = *(uint *)(this + 0xc);
    uVar1 = *(uint *)&base->field_0xc;
    if ((matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>(Kernel::Term*,Kernel::Term*,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder&)
         ::subterms == '\0') &&
       (iVar3 = __cxa_guard_acquire(&matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>(Kernel::Term*,Kernel::Term*,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder&)
                                     ::subterms), iVar3 != 0)) {
      matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>
      ::subterms._capacity = 0x20;
      matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>
      ::subterms._stack = (TermList **)::operator_new(0x100,0x10);
      matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>
      ::subterms._end =
           matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>
           ::subterms._stack +
           matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>
           ::subterms._capacity;
      matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>
      ::subterms._cursor =
           matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>
           ::subterms._stack;
      __cxa_atexit(::Lib::Stack<Kernel::TermList_*>::~Stack,
                   &matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>
                    ::subterms,&__dso_handle);
      __cxa_guard_release(&matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>(Kernel::Term*,Kernel::Term*,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder&)
                           ::subterms);
    }
    pMVar6 = this + (ulong)(uVar5 & 0xfffffff) * 8 + 0x28;
    pTVar7 = base->_args + (uVar1 & 0xfffffff);
    matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>
    ::subterms._cursor =
         matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>
         ::subterms._stack;
    do {
      while( true ) {
        if ((*(uint *)(pMVar6 + -8) & 3) != 2) {
          if (matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>
              ::subterms._cursor ==
              matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>
              ::subterms._end) {
            ::Lib::Stack<Kernel::TermList_*>::expand
                      (&matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>
                        ::subterms);
          }
          *matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>
           ::subterms._cursor = (TermList *)(pTVar7 + -1);
          matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>
          ::subterms._cursor =
               matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>
               ::subterms._cursor + 1;
          if (matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>
              ::subterms._cursor ==
              matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>
              ::subterms._end) {
            ::Lib::Stack<Kernel::TermList_*>::expand
                      (&matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>
                        ::subterms);
          }
          *matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>
           ::subterms._cursor = (TermList *)(pMVar6 + -8);
          matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>
          ::subterms._cursor =
               matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>
               ::subterms._cursor + 1;
        }
        TVar4._content = *(uint64_t *)pMVar6;
        if (((uint)TVar4._content & 3) != 3) break;
        __addr._content = TVar4._content;
        TVar4._content = pTVar7->_content;
LAB_0033cb8c:
        *(uint64_t *)(instance->_vptr_Term[6] + (__addr._content & 0x3fffffffc) * 2) =
             TVar4._content;
LAB_0033cba4:
        if (matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>
            ::subterms._cursor ==
            matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>
            ::subterms._stack) {
          return true;
        }
        pMVar6 = (MatchingUtils *)
                 matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>
                 ::subterms._cursor[-1];
        pTVar7 = matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>
                 ::subterms._cursor[-2];
        matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>
        ::subterms._cursor =
             matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher::Binder>
             ::subterms._cursor + -2;
      }
      __addr._content = pTVar7->_content;
      uVar5 = (uint)__addr._content & 3;
      if (uVar5 == 3) goto LAB_0033cb8c;
      if ((TVar4._content & 3) != 0) {
        iVar3 = Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::GenMatcher
                ::Binder::bind((Binder *)instance,(int)(TVar4._content >> 2),
                               (sockaddr *)__addr._content,uVar5);
        if ((char)iVar3 == '\0') {
          return false;
        }
        goto LAB_0033cba4;
      }
      if ((__addr._content & 3) != 0) {
        return false;
      }
      iVar3 = 1;
      if ((*(uint *)(TVar4._content + 8) == ((Term *)__addr._content)->_functor) &&
         ((((((TermList *)(TVar4._content + 0x28))->_content & 8) == 0 ||
           ((((Term *)__addr._content)->_args[0]._content & 8) == 0)) ||
          (((uVar5 = Term::numVarOccs((Term *)TVar4._content), uVar5 != 0 ||
            (*(uint64_t *)pMVar6 == pTVar7->_content)) &&
           (*(uint *)(TVar4._content + 0x10) <= ((Term *)__addr._content)->_weight)))))) {
        if ((*(uint *)(TVar4._content + 0xc) & 0xfffffff) == 0) {
          iVar3 = 0;
        }
        else {
          pMVar6 = (MatchingUtils *)
                   ((TermList *)(TVar4._content + 0x28) +
                   ((ulong)*(uint *)(TVar4._content + 0xc) & 0xfffffff));
          pTVar7 = ((Term *)__addr._content)->_args +
                   (*(uint *)&((Term *)__addr._content)->field_0xc & 0xfffffff);
          iVar3 = 3;
        }
      }
      if (iVar3 == 0) goto LAB_0033cba4;
    } while (iVar3 == 3);
  }
  return false;
}

Assistant:

bool MatchingUtils::matchArgs(Term* base, Term* instance, Binder& binder)
{
  ASS_EQ(base->functor(),instance->functor());
  if(base->shared() && instance->shared()) {
    if(base->weight() > instance->weight()) {
      return false;
    }
  }
  // Note: while this function only cares about the term structure,
  // for two-variable equalities we need to get the sort of the arguments from the Literal object.
  if(base->isLiteral() && static_cast<Literal*>(base)->isTwoVarEquality()){
    Literal* l1 = static_cast<Literal*>(base);
    Literal* l2 = static_cast<Literal*>(instance);
    if(!matchTerms(l1->twoVarEqSort(), SortHelper::getEqualityArgumentSort(l2), binder)){
      return false;
    }
  }
  ASS_G(base->arity(),0);

  TermList* bt=base->args();
  TermList* it=instance->args();

  static Stack<TermList*> subterms(32);
  subterms.reset();

  for (;;) {
    if (!bt->next()->isEmpty()) {
      subterms.push(it->next());
      subterms.push(bt->next());
    }
    if(bt->isSpecialVar()) {
      binder.specVar(bt->var(), *it);
    } else if(it->isSpecialVar()) {
      binder.specVar(it->var(), *bt);
    } else if(bt->isTerm()) {
      if(!it->isTerm()) {
	return false;
      }
      Term* s = bt->term();
      Term* t = it->term();
      if(s->functor()!=t->functor()) {
	return false;
      }
      if(bt->term()->shared() && it->term()->shared()) {
	if(bt->term()->ground() && *bt!=*it) {
	  return false;
	}
	if(s->weight() > t->weight()) {
	  return false;
	}
      }
      if(s->arity() > 0) {
	bt = s->args();
	it = t->args();
	continue;
      }
    } else {
      ASS(bt->isOrdinaryVar());
      if(!binder.bind(bt->var(), *it)) {
	return false;
      }
    }
    if(subterms.isEmpty()) {
      return true;
    }
    bt = subterms.pop();
    it = subterms.pop();
  }
}